

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_reference_unittest.cpp
# Opt level: O1

void __thiscall ArrayReference_metafunctions_Test::TestBody(ArrayReference_metafunctions_Test *this)

{
  bool bVar1;
  int iVar2;
  void *__ptr;
  char *message;
  void *ptr;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  internal local_20;
  undefined7 uStack_1f;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  iVar2 = posix_memalign((void **)&local_20,8,0x50);
  if (iVar2 == 0) {
    __ptr = (void *)CONCAT71(uStack_1f,local_20);
  }
  else {
    __ptr = (void *)0x0;
  }
  local_30.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000a;
  local_28.data_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (&local_20,"v1.size()","10",(unsigned_long *)&local_30,(int *)&local_28);
  if (local_20 == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
               ,0x48,message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
      local_30.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

TEST(ArrayReference, metafunctions) {
    using namespace memory;

    using by_value = Array<double, HostCoordinator<double>>;
    using by_view  = ArrayView<double, HostCoordinator<double>>;
    using by_reference = typename by_view::array_reference_type;

    // create range by value of length 10
    // this should allocate memory of length 10*sizeof(T)
    by_value v1(10);
    EXPECT_EQ(v1.size(), 10);

    by_reference vr1 = v1(0,5);
    by_view      vv1 = v1(0,5);

    // test that array_reference correctly detects an arary_reference
    static_assert(impl::is_array_reference<decltype(vr1)>::value,
                  "is_array_reference did not correctly classify array reference");
    static_assert(impl::is_array_reference<decltype(v1(all))>::value,
                  "is_array_reference did not correctly classify array reference");
    static_assert(impl::is_array_reference<decltype(v1(0,1))>::value,
                  "is_array_reference did not correctly classify array reference");

    // check that is_array_reference is false for an array_view
    static_assert(impl::is_array_reference<decltype(vv1)>::value==false,
                  "is_array_reference identified an array_view as an array_reference");

    // check that is_array_view returns true for ArrayReferences
    // this is desireable because is_array_view is designed for use in template
    // specializations, for which it is required that the argument foo(v(0,1))
    // should be treated as an ArrayView
    static_assert(impl::is_array_view<decltype(vr1)>::value,
                  "is_array_view did not correctly classify array reference");
    static_assert(impl::is_array_view<decltype(v1(all))>::value,
                  "is_array_view did not correctly classify array reference");
    static_assert(impl::is_array_view<decltype(v1(0,1))>::value,
                  "is_array_view did not correctly classify array reference");

}